

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electron.cpp
# Opt level: O2

void __thiscall Electron::ConcreteMachine<true>::get_typer_delay(ConcreteMachine<true> *this)

{
  string *in_RSI;
  
  get_typer_delay((ConcreteMachine<true> *)
                  &this[-1].speaker_.
                   super_LowpassBase<Outputs::Speaker::PullLowpass<Electron::SoundGenerator>,_false>
                   .super_Speaker.completed_sample_sets_,in_RSI);
  return;
}

Assistant:

HalfCycles get_typer_delay(const std::string &text) const final {
			if(!m6502_.get_is_resetting()) {
				return Cycles(0);
			}

			// Add a longer delay for a command at reset that involves pressing a modifier;
			// empirically this seems to be a requirement, in order to avoid a collision with
			// the system's built-in modifier-at-startup test (e.g. to perform shift+break).
			CharacterMapper test_mapper;
			const uint16_t *const sequence = test_mapper.sequence_for_character(text[0]);
			return is_modifier(Key(sequence[0])) ? Cycles(1'000'000) : Cycles(750'000);
		}